

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainFrame.c
# Opt level: O0

int Abc_FrameIsFlagEnabled(char *pFlag)

{
  int iVar1;
  char *__s1;
  char *pValue;
  char *pFlag_local;
  
  __s1 = Abc_FrameReadFlag(pFlag);
  if (__s1 == (char *)0x0) {
    pFlag_local._4_4_ = 0;
  }
  else {
    iVar1 = strcmp(__s1,"");
    if ((iVar1 != 0) && (iVar1 = strcmp(__s1,"1"), iVar1 != 0)) {
      return 0;
    }
    pFlag_local._4_4_ = 1;
  }
  return pFlag_local._4_4_;
}

Assistant:

int Abc_FrameIsFlagEnabled( char * pFlag )
{
    char * pValue;
    // if flag is not defined, it is not enabled
    pValue = Abc_FrameReadFlag( pFlag );
    if ( pValue == NULL )
        return 0;
    // if flag is defined but value is not empty (no parameter) or "1", it is not enabled
    if ( strcmp(pValue, "") && strcmp(pValue, "1") )
        return 0;
    return 1;
}